

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O1

bool __thiscall ParamEntry::contains(ParamEntry *this,ParamEntry *op2)

{
  if (((this->type == TYPE_UNKNOWN) || (op2->type == this->type)) && (this->spaceid == op2->spaceid)
     ) {
    if ((this->addressbase <= op2->addressbase) &&
       ((op2->addressbase + (long)op2->size) - 1 <= (this->addressbase + (long)this->size) - 1)) {
      return this->alignment == op2->alignment;
    }
  }
  return false;
}

Assistant:

bool ParamEntry::contains(const ParamEntry &op2) const

{
  if ((type!=TYPE_UNKNOWN)&&(op2.type != type)) return false;
  if (spaceid != op2.spaceid) return false;
  if (op2.addressbase < addressbase) return false;
  if ((op2.addressbase+op2.size-1) > (addressbase+size-1)) return false;
  if (alignment != op2.alignment) return false;
  return true;
}